

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O2

Node<const_volatile_void_*,_const_void_*> * __thiscall
QHashPrivate::Data<QHashPrivate::Node<void_const_volatile*,void_const*>>::
findNode<void_const_volatile*>
          (Data<QHashPrivate::Node<void_const_volatile*,void_const*>> *this,void **key)

{
  byte bVar1;
  Node<const_volatile_void_*,_const_void_*> *pNVar2;
  Bucket BVar3;
  
  BVar3 = findBucket<void_const_volatile*>(this,key);
  bVar1 = (BVar3.span)->offsets[BVar3.index];
  if (bVar1 == 0xff) {
    pNVar2 = (Node<const_volatile_void_*,_const_void_*> *)0x0;
  }
  else {
    pNVar2 = (Node<const_volatile_void_*,_const_void_*> *)((BVar3.span)->entries + bVar1);
  }
  return pNVar2;
}

Assistant:

Node *findNode(const K &key) const noexcept
    {
        auto bucket = findBucket(key);
        if (bucket.isUnused())
            return nullptr;
        return bucket.node();
    }